

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

char * Ses_ManExtractSolution(Ses_Man_t *pSes)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  void *__ptr;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  size_t __nmemb;
  void *pvVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar22 [16];
  uint uVar28;
  int iVar29;
  int iVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  uVar2 = pSes->nGates;
  iVar5 = pSes->nSpecVars;
  iVar17 = pSes->nSpecFunc;
  __nmemb = (size_t)(int)((iVar5 + 2) * iVar17 + uVar2 * 4 + 3);
  pcVar3 = (char *)calloc(__nmemb,1);
  *pcVar3 = (char)iVar5;
  pcVar3[1] = (char)iVar17;
  pcVar15 = pcVar3 + 3;
  pcVar3[2] = (char)uVar2;
  if (0 < (int)uVar2) {
    iVar17 = 2;
    uVar18 = 0;
    iVar5 = 0;
    auVar38 = _DAT_0094a000;
    auVar39 = _DAT_0093d220;
    do {
      uVar2 = iVar5 * 3 + pSes->nGateOffset;
      if ((int)uVar2 < 0) {
LAB_002c2cba:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      uVar4 = pSes->pSat->size;
      if ((((int)uVar4 <= (int)uVar2) || (uVar4 <= uVar2 + 1)) || (uVar4 <= uVar2 + 2))
      goto LAB_002c2cba;
      piVar1 = pSes->pSat->model;
      *pcVar15 = (piVar1[uVar2] == 1) + (piVar1[uVar2 + 1] == 1) * '\x02' +
                 (piVar1[uVar2 + 2] == 1) * '\x04';
      pcVar15[1] = '\x02';
      if (pSes->fExtractVerbose != 0) {
        printf("add gate %d with operation %d",(ulong)(uint)(pSes->nSpecVars + iVar5));
        auVar38 = _DAT_0094a000;
        auVar39 = _DAT_0093d220;
      }
      pcVar15 = pcVar15 + 2;
      iVar16 = pSes->nSpecVars;
      iVar8 = iVar16 + iVar5;
      if (iVar8 != 0 && SCARRY4(iVar16,iVar5) == iVar8 < 0) {
        uVar2 = 0;
        do {
          if (0 < (int)uVar2) {
            if (pSes->nGates <= iVar5) {
              __assert_fail("i < pSes->nGates",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
            }
            iVar11 = iVar16 + 1;
            if (iVar16 + 1 < iVar8) {
              iVar11 = iVar8;
            }
            iVar12 = (iVar11 - iVar16) + -1;
            auVar19._4_4_ = iVar12;
            auVar19._0_4_ = iVar12;
            auVar19._8_4_ = iVar12;
            auVar19._12_4_ = iVar12;
            uVar4 = 0;
            auVar19 = auVar19 ^ auVar39;
            do {
              iVar12 = pSes->nSelectOffset;
              if (iVar5 != 0) {
                iVar12 = 4;
                iVar29 = iVar16 + auVar38._0_4_;
                iVar32 = iVar16 + auVar38._4_4_;
                uVar34 = iVar16 + auVar38._8_4_;
                iVar36 = iVar16 + auVar38._12_4_;
                uVar21 = pSes->nSelectOffset;
                uVar24 = 0;
                uVar26 = 0;
                uVar28 = 0;
                do {
                  uVar27 = uVar28;
                  uVar25 = uVar26;
                  uVar23 = uVar24;
                  uVar20 = uVar21;
                  auVar31._0_4_ = iVar29 + -1;
                  auVar31._4_4_ = iVar32 + -1;
                  auVar31._8_4_ = uVar34 - 1;
                  auVar31._12_4_ = iVar36 - 1;
                  auVar22._4_4_ = iVar32;
                  auVar22._0_4_ = iVar32;
                  auVar22._8_4_ = iVar36;
                  auVar22._12_4_ = iVar36;
                  uVar21 = (auVar31._0_4_ * iVar29) / 2 + uVar20;
                  uVar24 = (iVar32 * auVar31._4_4_) / 2 + uVar23;
                  uVar26 = (int)((auVar31._8_8_ & 0xffffffff) * (ulong)uVar34) / 2 + uVar25;
                  uVar28 = (int)((auVar22._8_8_ & 0xffffffff) * (ulong)auVar31._12_4_) / 2 + uVar27;
                  iVar29 = iVar29 + 4;
                  iVar32 = iVar32 + 4;
                  uVar34 = uVar34 + 4;
                  iVar36 = iVar36 + 4;
                  iVar13 = iVar12 + -4;
                  iVar14 = iVar12 + ((iVar11 - iVar16) + 3U & 0xfffffffc);
                  iVar12 = iVar13;
                } while (iVar14 != 8);
                iVar13 = -iVar13;
                auVar30._4_4_ = iVar13;
                auVar30._0_4_ = iVar13;
                auVar30._8_4_ = iVar13;
                auVar30._12_4_ = iVar13;
                auVar31 = (auVar30 | auVar38) ^ auVar39;
                uVar34 = -(uint)(auVar19._0_4_ < auVar31._0_4_);
                uVar33 = -(uint)(auVar19._4_4_ < auVar31._4_4_);
                uVar35 = -(uint)(auVar19._8_4_ < auVar31._8_4_);
                uVar37 = -(uint)(auVar19._12_4_ < auVar31._12_4_);
                iVar12 = (~uVar37 & uVar28 | uVar27 & uVar37) + (~uVar33 & uVar24 | uVar23 & uVar33)
                         + (~uVar35 & uVar26 | uVar25 & uVar35) +
                           (~uVar34 & uVar21 | uVar20 & uVar34);
              }
              uVar34 = ~uVar4 + uVar2 + (int)((iVar8 * 2 + ~uVar4) * uVar4) / 2 + iVar12;
              if (((int)uVar34 < 0) || (pSes->pSat->size <= (int)uVar34)) goto LAB_002c2cba;
              if (pSes->pSat->model[uVar34] == 1) {
                if (pSes->fExtractVerbose != 0) {
                  printf(" and operands %d and %d",(ulong)uVar4,(ulong)uVar2);
                  auVar38 = _DAT_0094a000;
                  auVar39 = _DAT_0093d220;
                }
                *pcVar15 = (char)uVar4;
                pcVar15[1] = (char)uVar2;
                pcVar15 = pcVar15 + 2;
                iVar16 = pSes->nSpecVars;
                uVar2 = iVar16 + iVar5;
                break;
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar2);
          }
          uVar2 = uVar2 + 1;
          iVar8 = iVar16 + iVar5;
        } while ((int)uVar2 < iVar8);
      }
      if (pSes->fExtractVerbose != 0) {
        if (0 < pSes->nMaxDepth) {
          printf(" and depth vector ");
          iVar8 = pSes->nArrTimeMax;
          if (-1 < iVar8 + iVar5) {
            iVar16 = -1;
            do {
              if (pSes->nGates <= iVar5) {
                __assert_fail("i < pSes->nGates",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                              ,0x3f4,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
              }
              uVar2 = iVar8 * iVar5 + pSes->nDepthOffset + (uVar18 >> 1) + iVar16 + 1;
              if (((int)uVar2 < 0) || (pSes->pSat->size <= (int)uVar2)) goto LAB_002c2cba;
              printf("%d",(ulong)(pSes->pSat->model[uVar2] == 1));
              iVar8 = pSes->nArrTimeMax;
              iVar16 = iVar16 + 1;
            } while (iVar16 < iVar8 + iVar5);
          }
        }
        putchar(10);
        auVar38 = _DAT_0094a000;
        auVar39 = _DAT_0093d220;
      }
      iVar5 = iVar5 + 1;
      uVar2 = pSes->nGates;
      uVar18 = uVar18 + iVar17;
      iVar17 = iVar17 + 2;
    } while (iVar5 < (int)uVar2);
  }
  iVar5 = pSes->nMaxDepth;
  if (iVar5 == -1) {
    __ptr = (void *)0x0;
  }
  else {
    uVar18 = pSes->nSpecVars;
    __ptr = calloc((long)(int)(uVar18 * uVar2),4);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      pvVar9 = __ptr;
      do {
        if (0 < (int)uVar18) {
          uVar4 = (uint)pcVar3[uVar7 * 4 + 6];
          uVar34 = (uint)pcVar3[uVar7 * 4 + 5];
          uVar6 = 0;
          do {
            iVar8 = 0;
            iVar17 = 0;
            if ((int)uVar18 <= (int)uVar34) {
              iVar17 = *(int *)((long)__ptr +
                               uVar6 * 4 + (long)(int)((uVar34 - uVar18) * uVar18) * 4);
            }
            if ((int)uVar18 <= (int)uVar4) {
              iVar8 = *(int *)((long)__ptr + uVar6 * 4 + (long)(int)((uVar4 - uVar18) * uVar18) * 4)
              ;
            }
            if (iVar17 == 0 && iVar8 == 0) {
              uVar21 = (uint)(uVar4 == uVar6 || uVar34 == uVar6);
            }
            else {
              if (iVar8 < iVar17) {
                iVar8 = iVar17;
              }
              uVar21 = iVar8 + 1;
            }
            *(uint *)((long)pvVar9 + uVar6 * 4) = uVar21;
            uVar6 = uVar6 + 1;
          } while (uVar18 != uVar6);
        }
        uVar7 = uVar7 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar18 * 4);
      } while (uVar7 != uVar2);
    }
  }
  iVar17 = pSes->nSpecFunc;
  if (0 < iVar17) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar5 = 0;
        do {
          if (pSes->nSpecFunc <= (int)uVar18) {
            __assert_fail("h < pSes->nSpecFunc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d2,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          uVar2 = uVar2 * uVar18 + iVar5 + pSes->nOutputOffset;
          if (((int)uVar2 < 0) || (pSes->pSat->size <= (int)uVar2)) goto LAB_002c2cba;
          if (pSes->pSat->model[uVar2] == 1) {
            *pcVar15 = (((uint)pSes->bSpecInv >> (uVar18 & 0x1f) & 1) != 0) + (char)iVar5 * '\x02';
            uVar7 = 0;
            if (pSes->nMaxDepth != -1) {
              iVar17 = pSes->nSpecVars;
              if (0 < (long)iVar17) {
                lVar10 = 0;
                uVar7 = 0;
                do {
                  if (pSes->pArrTimeProfile == (int *)0x0) {
                    uVar2 = *(uint *)((long)__ptr + lVar10 * 4 + (ulong)(uint)(iVar17 * iVar5) * 4);
                  }
                  else {
                    uVar2 = *(int *)((long)__ptr + lVar10 * 4 + (ulong)(uint)(iVar17 * iVar5) * 4) +
                            pSes->pArrTimeProfile[lVar10];
                  }
                  if ((int)uVar7 <= (int)uVar2) {
                    uVar7 = (ulong)uVar2;
                  }
                  lVar10 = lVar10 + 1;
                } while (iVar17 != lVar10);
              }
            }
            pcVar15[1] = (char)uVar7;
            if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
              printf("output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n"
                     ,(ulong)uVar18,(ulong)(uint)(pSes->nSpecVars + iVar5),uVar7,
                     (ulong)(uint)pSes->nArrTimeDelta);
            }
            pcVar15 = pcVar15 + 2;
            uVar7 = (ulong)(uint)pSes->nSpecVars;
            if (0 < pSes->nSpecVars) {
              uVar6 = 0;
              do {
                if (pSes->nMaxDepth == -1) {
                  uVar2 = 0;
                }
                else {
                  uVar2 = *(uint *)((long)__ptr + (long)((int)uVar7 * iVar5 + (int)uVar6) * 4);
                }
                if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
                  printf("  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n",
                         uVar6 & 0xffffffff,(ulong)uVar2,(ulong)(uint)pSes->pArrTimeProfile[uVar6]);
                }
                pcVar15[uVar6] = (char)uVar2;
                uVar6 = uVar6 + 1;
                uVar7 = (ulong)pSes->nSpecVars;
              } while ((long)uVar6 < (long)uVar7);
              pcVar15 = pcVar15 + uVar6;
            }
          }
          iVar5 = iVar5 + 1;
          uVar2 = pSes->nGates;
        } while (iVar5 < (int)uVar2);
        iVar17 = pSes->nSpecFunc;
      }
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < iVar17);
    iVar5 = pSes->nMaxDepth;
  }
  if ((__ptr != (void *)0x0) && (iVar5 != -1)) {
    free(__ptr);
  }
  if ((long)pcVar15 - (long)pcVar3 != __nmemb) {
    __assert_fail("( p - pSol ) == nSol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,0x6d4,"char *Ses_ManExtractSolution(Ses_Man_t *)");
  }
  return pcVar3;
}

Assistant:

static char * Ses_ManExtractSolution( Ses_Man_t * pSes )
{
    int nSol, h, i, j, k, l, aj, ak, d, nOp;
    char * pSol, * p;
    int * pPerm = NULL; /* will be a 2d array [i][l] where is is gate id and l is PI id */

    /* compute length of solution, for now all gates have 2 inputs */
    nSol = 3 + pSes->nGates * 4 + pSes->nSpecFunc * ( 2 + pSes->nSpecVars );

    p = pSol = ABC_CALLOC( char, nSol );

    /* header */
    *p++ = pSes->nSpecVars;
    *p++ = pSes->nSpecFunc;
    *p++ = pSes->nGates;

    /* gates */
    for ( i = 0; i < pSes->nGates; ++i )
    {
        nOp  = sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 0, 1 ) );
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 0 ) ) << 1;
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 1 ) ) << 2;

        *p++ = nOp;
        *p++ = 2;

        if ( pSes->fExtractVerbose )
            printf( "add gate %d with operation %d", pSes->nSpecVars + i, nOp );

        for ( k = 0; k < pSes->nSpecVars + i; ++k )
            for ( j = 0; j < k; ++j )
                if ( sat_solver_var_value( pSes->pSat, Ses_ManSelectVar( pSes, i, j, k ) ) )
                {
                    if ( pSes->fExtractVerbose )
                        printf( " and operands %d and %d", j, k );
                    *p++ = j;
                    *p++ = k;
                    k = pSes->nSpecVars + i;
                    break;
                }

        if ( pSes->fExtractVerbose )
        {
            if ( pSes->nMaxDepth > 0 )
            {
                printf( " and depth vector " );
                for ( j = 0; j <= pSes->nArrTimeMax + i; ++j )
                    printf( "%d", sat_solver_var_value( pSes->pSat, Ses_ManDepthVar( pSes, i, j ) ) );
            }
            printf( "\n" );
        }
    }

    /* pin-to-pin delay */
    if ( pSes->nMaxDepth != -1 )
    {
        pPerm = ABC_CALLOC( int, pSes->nGates * pSes->nSpecVars );
        for ( i = 0; i < pSes->nGates; ++i )
        {
            /* since all gates are binary for now */
            j = pSol[3 + i * 4 + 2];
            k = pSol[3 + i * 4 + 3];

            for ( l = 0; l < pSes->nSpecVars; ++l )
            {
                /* pin-to-pin delay to input l of child nodes */
                aj = j < pSes->nSpecVars ? 0 : pPerm[(j - pSes->nSpecVars) * pSes->nSpecVars + l];
                ak = k < pSes->nSpecVars ? 0 : pPerm[(k - pSes->nSpecVars) * pSes->nSpecVars + l];

                if ( aj == 0 && ak == 0 )
                    pPerm[i * pSes->nSpecVars + l] = ( l == j || l == k ) ? 1 : 0;
                else
                    pPerm[i * pSes->nSpecVars + l] = Abc_MaxInt( aj, ak ) + 1;
            }
        }
    }

    /* outputs */
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        for ( i = 0; i < pSes->nGates; ++i )
            if ( sat_solver_var_value( pSes->pSat, Ses_ManOutputVar( pSes, h, i ) ) )
            {
                *p++ = Abc_Var2Lit( i, ( pSes->bSpecInv >> h ) & 1 );
                d = 0;
                if ( pSes->nMaxDepth != -1 )
                    for ( l = 0; l < pSes->nSpecVars; ++l )
                    {
                        if ( pSes->pArrTimeProfile )
                            d = Abc_MaxInt( d, pSes->pArrTimeProfile[l] + pPerm[i * pSes->nSpecVars + l] );
                        else
                            d = Abc_MaxInt( d, pPerm[i * pSes->nSpecVars + l] );
                    }
                *p++ = d;
                if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                    printf( "output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n", h, pSes->nSpecVars + i, d, pSes->nArrTimeDelta );
                for ( l = 0; l < pSes->nSpecVars; ++l )
                {
                    d = ( pSes->nMaxDepth != -1 ) ? pPerm[i * pSes->nSpecVars + l] : 0;
                    if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                        printf( "  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n", l, d, pSes->pArrTimeProfile[l] );
                    *p++ = d;
                }
            }

    /* pin-to-pin delays */
    if ( pSes->nMaxDepth != -1 )
        ABC_FREE( pPerm );

    /* have we used all the fields? */
    assert( ( p - pSol ) == nSol );

    /* printf( "found network: " ); */
    /* Abc_TtPrintHexRev( stdout, Ses_ManDeriveTruth( pSes, pSol, 1 ), pSes->nSpecVars ); */
    /* printf( "\n" ); */

    return pSol;
}